

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.h
# Opt level: O0

void __thiscall
Inline::Inline(Inline *this,Func *topFunc,InliningHeuristics *heuristics,uint lCount,
              uint currentInlineeFrameSlot,bool isApplyTargetInliningInProgress,Inline *prevFrame,
              Instr *callingInstr)

{
  bool isApplyTargetInliningInProgress_local;
  uint currentInlineeFrameSlot_local;
  uint lCount_local;
  InliningHeuristics *heuristics_local;
  Func *topFunc_local;
  Inline *this_local;
  
  this->topFunc = topFunc;
  this->inlineesProcessed = 0;
  this->currentInlineeFrameSlot = currentInlineeFrameSlot;
  this->isInLoop = lCount;
  this->isApplyTargetInliningInProgress = isApplyTargetInliningInProgress;
  this->isInInlinedApplyCall = false;
  this->inliningHeuristics = heuristics;
  this->prevFrame = prevFrame;
  this->prevFrameCallInstr = callingInstr;
  return;
}

Assistant:

Inline(Func *topFunc, 
        InliningHeuristics &heuristics, 
        uint lCount = 0, 
        uint currentInlineeFrameSlot = 0, 
        bool isApplyTargetInliningInProgress = false, 
        Inline * prevFrame = nullptr, 
        IR::Instr * callingInstr = nullptr
    ) :
        topFunc(topFunc), 
        inlineesProcessed(0), 
        currentInlineeFrameSlot(currentInlineeFrameSlot), 
        isInLoop(lCount), 
        inliningHeuristics(heuristics),
        isApplyTargetInliningInProgress(isApplyTargetInliningInProgress), 
        isInInlinedApplyCall(false), 
        prevFrame(prevFrame),
        prevFrameCallInstr(callingInstr)
    {}